

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

string * __thiscall
glcts::ViewportArray::DrawMultipleLayers::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawMultipleLayers *this)

{
  GLchar *__s;
  allocator<char> local_1a;
  undefined1 local_19;
  DrawMultipleLayers *local_18;
  DrawMultipleLayers *this_local;
  string *result;
  
  __s = getGeometryShader::source;
  local_19 = 0;
  local_18 = this;
  this_local = (DrawMultipleLayers *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawMultipleLayers::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 16)         in;\n"
								  "layout(triangle_strip, max_vertices = 4) out;\n"
								  "\n"
								  "flat out int gs_fs_color;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    gs_fs_color      = gl_InvocationID;\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Layer         = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}